

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O1

void lyjson_ctx_restore(lyjson_ctx *jsonctx)

{
  uint32_t uVar1;
  size_t sVar2;
  
  if (jsonctx->dynamic != '\0') {
    free(jsonctx->value);
  }
  uVar1 = (jsonctx->backup).status_count;
  (jsonctx->status).count = uVar1;
  (jsonctx->status).field_2.dnodes[uVar1 - 1] = (lyd_node *)(ulong)(jsonctx->backup).status;
  sVar2 = (jsonctx->backup).value_len;
  jsonctx->value = (jsonctx->backup).value;
  jsonctx->value_len = sVar2;
  jsonctx->in->current = (jsonctx->backup).input;
  jsonctx->dynamic = (jsonctx->backup).dynamic;
  (jsonctx->backup).dynamic = '\0';
  return;
}

Assistant:

void
lyjson_ctx_restore(struct lyjson_ctx *jsonctx)
{
    if (jsonctx->dynamic) {
        free((char *)jsonctx->value);
    }
    jsonctx->status.count = jsonctx->backup.status_count;
    jsonctx->status.objs[jsonctx->backup.status_count - 1] = (void *)jsonctx->backup.status;
    jsonctx->value = jsonctx->backup.value;
    jsonctx->value_len = jsonctx->backup.value_len;
    jsonctx->in->current = jsonctx->backup.input;
    jsonctx->dynamic = jsonctx->backup.dynamic;
    jsonctx->backup.dynamic = 0;
}